

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void aom_paeth_predictor_16x16_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  int iVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  __m256i l16;
  __m256i tl16;
  __m256i top;
  __m256i local_c0;
  __m256i local_a0;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  
  uVar2 = *(undefined8 *)*(undefined1 (*) [16])(left + 0x10);
  uVar3 = *(undefined8 *)(left + 0x18);
  auVar5 = *(undefined1 (*) [16])(left + 0x10);
  bVar1 = above[-1];
  local_a0[0] = (ulong)CONCAT16(bVar1,(uint6)CONCAT14(bVar1,(uint)CONCAT12(bVar1,(ushort)bVar1)));
  local_a0[1]._0_1_ = bVar1;
  local_a0[1]._1_1_ = 0;
  local_a0[1]._2_1_ = bVar1;
  local_a0[1]._3_1_ = 0;
  local_a0[1]._4_1_ = bVar1;
  local_a0[1]._5_1_ = 0;
  local_a0[1]._6_1_ = bVar1;
  local_a0[1]._7_1_ = 0;
  local_a0[2]._0_1_ = bVar1;
  local_a0[2]._1_1_ = 0;
  local_a0[2]._2_1_ = bVar1;
  local_a0[2]._3_1_ = 0;
  local_a0[2]._4_1_ = bVar1;
  local_a0[2]._5_1_ = 0;
  local_a0[2]._6_1_ = bVar1;
  local_a0[2]._7_1_ = 0;
  local_a0[3]._0_1_ = bVar1;
  local_a0[3]._1_1_ = 0;
  local_a0[3]._2_1_ = bVar1;
  local_a0[3]._3_1_ = 0;
  local_a0[3]._4_1_ = bVar1;
  local_a0[3]._5_1_ = 0;
  local_a0[3]._6_1_ = bVar1;
  local_a0[3]._7_1_ = 0;
  local_80 = vpmovzxbw_avx(*(undefined1 (*) [16])above);
  local_70 = vpunpckhbw_avx(*(undefined1 (*) [16])above,(undefined1  [16])0x0);
  auVar9._8_8_ = 0x8000800080008000;
  auVar9._0_8_ = 0x8000800080008000;
  auVar9._16_8_ = 0x8000800080008000;
  auVar9._24_8_ = 0x8000800080008000;
  iVar6 = 0x10;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    auVar4._16_8_ = uVar2;
    auVar4._0_16_ = auVar5;
    auVar4._24_8_ = uVar3;
    local_c0 = (__m256i)vpshufb_avx2(auVar4,auVar9);
    auVar8 = local_c0._0_16_;
    paeth_16x1_pred(&local_c0,(__m256i *)local_80,&local_a0);
    *(undefined1 (*) [16])dst = auVar8;
    dst = *(undefined1 (*) [16])dst + stride;
    auVar9 = vpsubw_avx2(auVar9,_DAT_0046a440);
  }
  return;
}

Assistant:

void aom_paeth_predictor_16x16_avx2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  const __m256i l = get_left_vector(left);
  const __m256i tl16 = _mm256_set1_epi16((int16_t)above[-1]);
  __m256i rep = _mm256_set1_epi16((short)0x8000);
  const __m256i one = _mm256_set1_epi16(1);
  const __m256i top = get_top_vector(above);

  int i;
  for (i = 0; i < 16; ++i) {
    const __m256i l16 = _mm256_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm256_add_epi16(rep, one);
  }
}